

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_chain
          (Impl *this,void *pNext,ScratchAllocator *alloc,void **out_pnext,
          DynamicStateInfo *dynamic_state_info,VkGraphicsPipelineLibraryFlagsEXT state_flags)

{
  int iVar1;
  long lVar2;
  Impl *pIVar3;
  void *__src;
  undefined8 uVar4;
  Impl *pIVar5;
  Impl *pIVar6;
  DatabaseInterface *pDVar7;
  _Hash_node_base *p_Var8;
  _Hash_node_base *p_Var9;
  _Hash_node_base *p_Var10;
  _Hash_node_base *p_Var11;
  _Hash_node_base *p_Var12;
  _Hash_node_base *p_Var13;
  _Hash_node_base *p_Var14;
  bool bVar15;
  Impl *this_00;
  undefined8 *puVar16;
  __node_base_ptr p_Var17;
  void *__dest;
  _Hash_node_base *p_Var18;
  VkBaseInStructure *pin;
  ulong size;
  void **ppvVar19;
  long *in_FS_OFFSET;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  void *local_38;
  
  ppvVar19 = &local_38;
  local_38 = (void *)0x0;
  lVar2 = *in_FS_OFFSET;
  do {
    this_00 = (Impl *)pnext_chain_skip_ignored_entries(pNext);
    if (this_00 == (Impl *)0x0) {
      *out_pnext = local_38;
      break;
    }
    iVar1 = *(int *)&(this_00->allocator).impl;
    if (iVar1 < 0x3b9e3cd0) {
      if (iVar1 < 0x3b9cc5d1) {
        if (iVar1 < 0x3b9c4cb9) {
          if (iVar1 < 0x3b9b75e2) {
            if (iVar1 != 0x10) {
              if (iVar1 == 0x3b9b3762) goto LAB_00120c89;
              goto LAB_00120f51;
            }
            puVar16 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x28,0x10);
            if (puVar16 != (undefined8 *)0x0) {
              pIVar3 = (this_00->allocator).impl;
              pIVar5 = (this_00->temp_allocator).impl;
              pIVar6 = (this_00->ycbcr_temp_allocator).impl;
              pDVar7 = this_00->database_iface;
              puVar16[4] = this_00->module_identifier_database_iface;
              puVar16[2] = pIVar6;
              puVar16[3] = pDVar7;
              *puVar16 = pIVar3;
              puVar16[1] = pIVar5;
            }
            puVar16[1] = 0;
            if ((ulong)puVar16[3] < 4) {
              __dest = (void *)0x0;
            }
            else {
              __src = (void *)puVar16[4];
              size = puVar16[3] & 0xfffffffffffffffc;
              __dest = ScratchAllocator::allocate_raw(alloc,size,0x10);
              if (__dest != (void *)0x0) {
                memmove(__dest,__src,size);
              }
            }
            puVar16[4] = __dest;
          }
          else if (iVar1 == 0x3b9b75e2) {
            puVar16 = (undefined8 *)
                      copy_pnext_struct((Impl *)pNext,(VkPipelineRenderingCreateInfoKHR *)this_00,
                                        alloc,state_flags);
          }
          else {
            if (iVar1 != 0x3b9b9908) {
              if (iVar1 == 0x3b9bd3a0) goto LAB_00120c47;
              goto LAB_00120f51;
            }
            puVar16 = (undefined8 *)
                      copy_pnext_struct((Impl *)pNext,(VkRenderPassMultiviewCreateInfo *)this_00,
                                        alloc);
          }
        }
        else {
          if (0x3b9c5870 < iVar1) {
            if (iVar1 != 0x3b9c5871) {
              if (iVar1 == 0x3b9c9309) {
                puVar16 = (undefined8 *)
                          copy_pnext_struct((Impl *)pNext,
                                            (VkRenderPassInputAttachmentAspectCreateInfo *)this_00,
                                            alloc);
                goto LAB_00120ef5;
              }
              if (iVar1 != 0x3b9c930b) goto LAB_00120f51;
            }
            goto LAB_00120c89;
          }
          if (iVar1 != 0x3b9c4cb9) {
            if (iVar1 == 0x3b9c5489) goto LAB_00120c47;
            goto LAB_00120f51;
          }
          puVar16 = (undefined8 *)
                    copy_pnext_struct((Impl *)pNext,
                                      (VkPipelineDiscardRectangleStateCreateInfoEXT *)this_00,alloc,
                                      dynamic_state_info);
        }
      }
      else {
        if (0x3b9d2b60 < iVar1) {
          if (0x3b9dd358 < iVar1) {
            if (iVar1 == 0x3b9dd359) {
              puVar16 = (undefined8 *)
                        copy_pnext_struct(this,(VkSubpassDescriptionDepthStencilResolve *)this_00,
                                          alloc);
              goto LAB_00120eb2;
            }
            if ((iVar1 != 0x3b9e1d92) && (iVar1 != 0x3b9e38e9)) goto LAB_00120f51;
            goto LAB_00120c89;
          }
          if (iVar1 != 0x3b9d2b61) {
            if (iVar1 == 0x3b9d3ee8) {
              puVar16 = (undefined8 *)
                        copy_pnext_struct((Impl *)pNext,
                                          (VkDescriptorSetLayoutBindingFlagsCreateInfoEXT *)this_00,
                                          alloc);
            }
            else {
              if (iVar1 != 0x3b9db031) goto LAB_00120f51;
              puVar16 = (undefined8 *)
                        copy_pnext_struct((Impl *)pNext,
                                          (VkPipelineVertexInputDivisorStateCreateInfoKHR *)this_00,
                                          alloc);
            }
            goto LAB_00120ef5;
          }
          pIVar3 = (this_00->ycbcr_temp_allocator).impl;
          p_Var17 = std::
                    _Hashtable<VkSamplerYcbcrConversion_T_*,_std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>,_std::allocator<std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<VkSamplerYcbcrConversion_T_*>,_std::hash<VkSamplerYcbcrConversion_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::_M_find_before_node
                              (&(this->ycbcr_conversions)._M_h,
                               (ulong)pIVar3 % (this->ycbcr_conversions)._M_h._M_bucket_count,
                               (key_type *)&this_00->ycbcr_temp_allocator,(__hash_code)pIVar3);
          p_Var18 = (_Hash_node_base *)0x0;
          if (p_Var17 != (__node_base_ptr)0x0) {
            p_Var18 = p_Var17->_M_nxt;
          }
          if (p_Var18 != (_Hash_node_base *)0x0) {
            p_Var18 = p_Var18[2]._M_nxt;
            puVar16 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x40,0x10);
            if (puVar16 != (undefined8 *)0x0) {
              p_Var8 = p_Var18->_M_nxt;
              p_Var9 = p_Var18[1]._M_nxt;
              p_Var10 = p_Var18[2]._M_nxt;
              p_Var11 = p_Var18[3]._M_nxt;
              p_Var12 = p_Var18[4]._M_nxt;
              p_Var13 = p_Var18[5]._M_nxt;
              p_Var14 = p_Var18[7]._M_nxt;
              puVar16[6] = p_Var18[6]._M_nxt;
              puVar16[7] = p_Var14;
              puVar16[4] = p_Var12;
              puVar16[5] = p_Var13;
              puVar16[2] = p_Var10;
              puVar16[3] = p_Var11;
              *puVar16 = p_Var8;
              puVar16[1] = p_Var9;
            }
            if (p_Var18[1]._M_nxt == (_Hash_node_base *)0x0) goto LAB_00120ef5;
          }
          goto LAB_00120f80;
        }
        if (iVar1 < 0x3b9cf89a) {
          if (iVar1 == 0x3b9cc5d1) goto LAB_00120c89;
          if (iVar1 != 0x3b9cf898) goto LAB_00120f51;
          puVar16 = (undefined8 *)
                    copy_pnext_struct((Impl *)pNext,(VkSampleLocationsInfoEXT *)this_00,alloc);
        }
        else if (iVar1 == 0x3b9cf89a) {
          puVar16 = (undefined8 *)
                    copy_pnext_struct((Impl *)pNext,
                                      (VkPipelineSampleLocationsStateCreateInfoEXT *)this_00,alloc,
                                      dynamic_state_info);
        }
        else {
          if (iVar1 == 0x3b9d0c22) goto LAB_00120c47;
          if (iVar1 != 0x3b9d2b60) goto LAB_00120f51;
          puVar16 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x40,0x10);
          if (puVar16 != (undefined8 *)0x0) {
            uVar20 = *(undefined4 *)&(this_00->allocator).impl;
            uVar21 = *(undefined4 *)((long)&(this_00->allocator).impl + 4);
            uVar22 = *(undefined4 *)&(this_00->temp_allocator).impl;
            uVar23 = *(undefined4 *)((long)&(this_00->temp_allocator).impl + 4);
            uVar24 = *(undefined4 *)&(this_00->ycbcr_temp_allocator).impl;
            uVar25 = *(undefined4 *)((long)&(this_00->ycbcr_temp_allocator).impl + 4);
            uVar26 = *(undefined4 *)&this_00->database_iface;
            uVar27 = *(undefined4 *)((long)&this_00->database_iface + 4);
            uVar28 = *(undefined4 *)&this_00->module_identifier_database_iface;
            uVar29 = *(undefined4 *)((long)&this_00->module_identifier_database_iface + 4);
            uVar30 = *(undefined4 *)&this_00->on_use_database_iface;
            uVar31 = *(undefined4 *)((long)&this_00->on_use_database_iface + 4);
            uVar4 = *(undefined8 *)&this_00->should_record_identifier_only;
            puVar16[6] = this_00->application_info_filter;
            puVar16[7] = uVar4;
            goto LAB_00120dc0;
          }
        }
      }
LAB_00120ef5:
      *ppvVar19 = puVar16;
      pNext = (this_00->temp_allocator).impl;
      puVar16[1] = 0;
      ppvVar19 = (void **)(puVar16 + 1);
      bVar15 = true;
    }
    else {
      if (iVar1 < 0x3b9f9490) {
        if (iVar1 < 0x3b9e776a) {
          if (iVar1 < 0x3b9e5441) {
            if (iVar1 != 0x3b9e3cd0) {
              if (iVar1 == 0x3b9e3cd1) goto LAB_00120c47;
              goto LAB_00120f51;
            }
            puVar16 = (undefined8 *)
                      copy_pnext_struct(this,(VkFragmentShadingRateAttachmentInfoKHR *)this_00,alloc
                                       );
LAB_00120eb2:
            if (puVar16 == (undefined8 *)0x0) goto LAB_00120f80;
          }
          else if (iVar1 == 0x3b9e5441) {
            puVar16 = (undefined8 *)
                      copy_pnext_struct((Impl *)pNext,
                                        (VkRenderingAttachmentLocationInfoKHR *)this_00,alloc);
          }
          else {
            if (iVar1 != 0x3b9e5442) {
              if (iVar1 == 0x3b9e7769) goto LAB_00120c89;
              goto LAB_00120f51;
            }
            puVar16 = (undefined8 *)
                      copy_pnext_struct((Impl *)pNext,
                                        (VkRenderingInputAttachmentIndexInfoKHR *)this_00,alloc);
          }
        }
        else if (iVar1 < 0x3b9f1b7a) {
          if ((iVar1 == 0x3b9e776a) || (iVar1 == 0x3b9eaa31)) {
LAB_00120c89:
            puVar16 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x18,0x10);
            if (puVar16 != (undefined8 *)0x0) {
              uVar20 = *(undefined4 *)&(this_00->allocator).impl;
              uVar21 = *(undefined4 *)((long)&(this_00->allocator).impl + 4);
              uVar22 = *(undefined4 *)&(this_00->temp_allocator).impl;
              uVar23 = *(undefined4 *)((long)&(this_00->temp_allocator).impl + 4);
              puVar16[2] = (this_00->ycbcr_temp_allocator).impl;
              goto LAB_00120dca;
            }
          }
          else {
            if (iVar1 != 0x3b9ebdb9) goto LAB_00120f51;
LAB_00120c47:
            puVar16 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x20,0x10);
            if (puVar16 != (undefined8 *)0x0) {
              uVar20 = *(undefined4 *)&(this_00->allocator).impl;
              uVar21 = *(undefined4 *)((long)&(this_00->allocator).impl + 4);
              uVar22 = *(undefined4 *)&(this_00->temp_allocator).impl;
              uVar23 = *(undefined4 *)((long)&(this_00->temp_allocator).impl + 4);
              uVar24 = *(undefined4 *)&(this_00->ycbcr_temp_allocator).impl;
              uVar25 = *(undefined4 *)((long)&(this_00->ycbcr_temp_allocator).impl + 4);
              uVar26 = *(undefined4 *)&this_00->database_iface;
              uVar27 = *(undefined4 *)((long)&this_00->database_iface + 4);
              goto LAB_00120dc5;
            }
          }
        }
        else {
          if (iVar1 == 0x3b9f1b7a) goto LAB_00120c89;
          if (iVar1 == 0x3b9f2b18) {
LAB_00120cb7:
            puVar16 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x28,0x10);
            if (puVar16 != (undefined8 *)0x0) {
              uVar20 = *(undefined4 *)&(this_00->allocator).impl;
              uVar21 = *(undefined4 *)((long)&(this_00->allocator).impl + 4);
              uVar22 = *(undefined4 *)&(this_00->temp_allocator).impl;
              uVar23 = *(undefined4 *)((long)&(this_00->temp_allocator).impl + 4);
              uVar24 = *(undefined4 *)&(this_00->ycbcr_temp_allocator).impl;
              uVar25 = *(undefined4 *)((long)&(this_00->ycbcr_temp_allocator).impl + 4);
              uVar26 = *(undefined4 *)&this_00->database_iface;
              uVar27 = *(undefined4 *)((long)&this_00->database_iface + 4);
              puVar16[4] = this_00->module_identifier_database_iface;
              goto LAB_00120dc5;
            }
          }
          else {
            if (iVar1 != 0x3b9f36d0) goto LAB_00120f51;
            puVar16 = (undefined8 *)
                      copy_pnext_struct((Impl *)pNext,(VkPipelineLibraryCreateInfoKHR *)this_00,
                                        alloc);
          }
        }
        goto LAB_00120ef5;
      }
      if (0x3ba09a48 < iVar1) {
        if (iVar1 < 0x3ba1d6b2) {
          if (iVar1 != 0x3ba09a49) {
            if (iVar1 == 0x3ba10f79) goto LAB_00120cb7;
            if (iVar1 == 0x3ba1c711) goto LAB_00120c89;
            goto LAB_00120f51;
          }
          puVar16 = (undefined8 *)
                    copy_pnext_struct((Impl *)pNext,(VkPipelineColorWriteCreateInfoEXT *)this_00,
                                      alloc,dynamic_state_info);
        }
        else if (iVar1 == 0x3ba1d6b2) {
          puVar16 = (undefined8 *)
                    copy_pnext_struct((Impl *)pNext,
                                      (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)this_00,
                                      alloc);
        }
        else if (iVar1 == 0x3ba1f5f5) {
          puVar16 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x18,0x10);
          if (puVar16 != (undefined8 *)0x0) {
            pIVar3 = (this_00->allocator).impl;
            pIVar5 = (this_00->temp_allocator).impl;
            puVar16[2] = (this_00->ycbcr_temp_allocator).impl;
            *puVar16 = pIVar3;
            puVar16[1] = pIVar5;
          }
          *(uint *)(puVar16 + 2) = *(uint *)(puVar16 + 2) & 0x7ffffc3f;
        }
        else {
          if (iVar1 != 0x3ba3ab71) goto LAB_00120f51;
          puVar16 = (undefined8 *)
                    copy_pnext_struct((Impl *)pNext,
                                      (VkPipelineViewportDepthClampControlCreateInfoEXT *)this_00,
                                      alloc,dynamic_state_info);
        }
        goto LAB_00120ef5;
      }
      if (iVar1 < 0x3ba0251a) {
        if (iVar1 == 0x3b9f9490) {
          puVar16 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x30,0x10);
          if (puVar16 == (undefined8 *)0x0) goto LAB_00120ef5;
          uVar20 = *(undefined4 *)&(this_00->allocator).impl;
          uVar21 = *(undefined4 *)((long)&(this_00->allocator).impl + 4);
          uVar22 = *(undefined4 *)&(this_00->temp_allocator).impl;
          uVar23 = *(undefined4 *)((long)&(this_00->temp_allocator).impl + 4);
          uVar24 = *(undefined4 *)&(this_00->ycbcr_temp_allocator).impl;
          uVar25 = *(undefined4 *)((long)&(this_00->ycbcr_temp_allocator).impl + 4);
          uVar26 = *(undefined4 *)&this_00->database_iface;
          uVar27 = *(undefined4 *)((long)&this_00->database_iface + 4);
          uVar28 = *(undefined4 *)&this_00->module_identifier_database_iface;
          uVar29 = *(undefined4 *)((long)&this_00->module_identifier_database_iface + 4);
          uVar30 = *(undefined4 *)&this_00->on_use_database_iface;
          uVar31 = *(undefined4 *)((long)&this_00->on_use_database_iface + 4);
LAB_00120dc0:
          *(undefined4 *)(puVar16 + 4) = uVar28;
          *(undefined4 *)((long)puVar16 + 0x24) = uVar29;
          *(undefined4 *)(puVar16 + 5) = uVar30;
          *(undefined4 *)((long)puVar16 + 0x2c) = uVar31;
LAB_00120dc5:
          *(undefined4 *)(puVar16 + 2) = uVar24;
          *(undefined4 *)((long)puVar16 + 0x14) = uVar25;
          *(undefined4 *)(puVar16 + 3) = uVar26;
          *(undefined4 *)((long)puVar16 + 0x1c) = uVar27;
LAB_00120dca:
          *(undefined4 *)puVar16 = uVar20;
          *(undefined4 *)((long)puVar16 + 4) = uVar21;
          *(undefined4 *)(puVar16 + 1) = uVar22;
          *(undefined4 *)((long)puVar16 + 0xc) = uVar23;
          goto LAB_00120ef5;
        }
        if (iVar1 == 0x3b9fac02) goto LAB_00120c89;
      }
      else {
        if (iVar1 == 0x3ba0251a) {
          puVar16 = (undefined8 *)
                    copy_pnext_struct((Impl *)pNext,(VkMutableDescriptorTypeCreateInfoEXT *)this_00,
                                      alloc);
          goto LAB_00120ef5;
        }
        if ((iVar1 == 0x3ba034b9) || (iVar1 == 0x3ba086c2)) goto LAB_00120c89;
      }
LAB_00120f51:
      if ((*(int *)(lVar2 + -0x18) < 3) &&
         (bVar15 = Internal::log_thread_callback(LOG_ERROR,"Cannot copy unknown pNext sType: %d.\n")
         , !bVar15)) {
        copy_pnext_chain(this_00);
      }
LAB_00120f80:
      bVar15 = false;
      pNext = this_00;
    }
  } while (bVar15);
  return this_00 == (Impl *)0x0;
}

Assistant:

bool StateRecorder::Impl::copy_pnext_chain(const void *pNext, ScratchAllocator &alloc, const void **out_pnext,
                                           const DynamicStateInfo *dynamic_state_info,
                                           VkGraphicsPipelineLibraryFlagsEXT state_flags)
{
	VkBaseInStructure new_pnext = {};
	const VkBaseInStructure **ppNext = &new_pnext.pNext;

	while ((pNext = pnext_chain_skip_ignored_entries(pNext)) != nullptr)
	{
		auto *pin = static_cast<const VkBaseInStructure *>(pNext);

		switch (pin->sType)
		{
		case VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_DOMAIN_ORIGIN_STATE_CREATE_INFO:
		{
			auto ci = static_cast<const VkPipelineTessellationDomainOriginStateCreateInfo *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO_KHR:
		{
			auto *ci = static_cast<const VkPipelineVertexInputDivisorStateCreateInfoKHR *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_DEPTH_CLIP_STATE_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineRasterizationDepthClipStateCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_STREAM_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineRasterizationStateStreamCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_RENDER_PASS_MULTIVIEW_CREATE_INFO:
		{
			auto *ci = static_cast<const VkRenderPassMultiviewCreateInfo *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_BINDING_FLAGS_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkDescriptorSetLayoutBindingFlagsCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_ADVANCED_STATE_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineColorBlendAdvancedStateCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_CONSERVATIVE_STATE_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineRasterizationConservativeStateCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_LINE_STATE_CREATE_INFO_KHR:
		{
			auto *ci = static_cast<const VkPipelineRasterizationLineStateCreateInfoKHR *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineShaderStageRequiredSubgroupSizeCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_MUTABLE_DESCRIPTOR_TYPE_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkMutableDescriptorTypeCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_STENCIL_LAYOUT:
		{
			auto *ci = static_cast<const VkAttachmentDescriptionStencilLayout *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_STENCIL_LAYOUT:
		{
			auto *ci = static_cast<const VkAttachmentReferenceStencilLayout *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_DEPTH_STENCIL_RESOLVE:
		{
			auto *ci = static_cast<const VkSubpassDescriptionDepthStencilResolve *>(pNext);
			auto *resolve = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			if (!resolve)
				return false;
			*ppNext = resolve;
			break;
		}

		case VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR:
		{
			auto *ci = static_cast<const VkFragmentShadingRateAttachmentInfoKHR *>(pNext);
			auto *rate = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			if (!rate)
				return false;
			*ppNext = rate;
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO_KHR:
		{
			auto *ci = static_cast<const VkPipelineRenderingCreateInfoKHR *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc, state_flags));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_COLOR_WRITE_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineColorWriteCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc, dynamic_state_info));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_SAMPLE_LOCATIONS_STATE_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineSampleLocationsStateCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc, dynamic_state_info));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_PROVOKING_VERTEX_STATE_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineRasterizationProvokingVertexStateCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_CUSTOM_BORDER_COLOR_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkSamplerCustomBorderColorCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_REDUCTION_MODE_CREATE_INFO:
		{
			auto *ci = static_cast<const VkSamplerReductionModeCreateInfo *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_RENDER_PASS_INPUT_ATTACHMENT_ASPECT_CREATE_INFO:
		{
			auto *ci = static_cast<const VkRenderPassInputAttachmentAspectCreateInfo *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_DISCARD_RECTANGLE_STATE_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineDiscardRectangleStateCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc, dynamic_state_info));
			break;
		}

		case VK_STRUCTURE_TYPE_MEMORY_BARRIER_2_KHR:
		{
			auto *ci = static_cast<const VkMemoryBarrier2KHR *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_FRAGMENT_SHADING_RATE_STATE_CREATE_INFO_KHR:
		{
			auto *ci = static_cast<const VkPipelineFragmentShadingRateStateCreateInfoKHR *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_CREATE_INFO:
		{
			auto *ci = static_cast<const VkSamplerYcbcrConversionCreateInfo *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_INFO:
		{
			// Special case. Instead of serializing the YCbCr object link, serialize the original create info.
			// Reduces excessive churn for supporting an extremely niche object type.
			auto *ci = static_cast<const VkSamplerYcbcrConversionInfo *>(pNext);
			auto ycbcr = ycbcr_conversions.find(ci->conversion);
			if (ycbcr == ycbcr_conversions.end())
				return false;

			VkSamplerYcbcrConversionCreateInfo *new_create_info;
			if (!copy_ycbcr_conversion(ycbcr->second, alloc, &new_create_info))
				return false;

			*ppNext = reinterpret_cast<VkBaseInStructure *>(new_create_info);
			break;
		}

		case VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkGraphicsPipelineLibraryCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO:
		{
			auto *ci = static_cast<const VkShaderModuleCreateInfo *>(pNext);
			VkShaderModuleCreateInfo *new_module = nullptr;
			if (!copy_shader_module(ci, alloc, true, &new_module))
				return false;
			*ppNext = reinterpret_cast<VkBaseInStructure *>(new_module);
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR:
		{
			auto *ci = static_cast<const VkPipelineLibraryCreateInfoKHR *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLIP_CONTROL_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineViewportDepthClipControlCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineShaderStageModuleIdentifierCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR:
		{
			auto *ci = static_cast<const VkPipelineCreateFlags2CreateInfoKHR *>(pNext);
			auto *flags2 = static_cast<VkPipelineCreateFlags2CreateInfoKHR *>(copy_pnext_struct_simple(ci, alloc));
			flags2->flags = normalize_pipeline_creation_flags(flags2->flags);
			*ppNext = reinterpret_cast<VkBaseInStructure *>(flags2);
			break;
		}

		case VK_STRUCTURE_TYPE_RENDER_PASS_CREATION_CONTROL_EXT:
		{
			auto *ci = static_cast<const VkRenderPassCreationControlEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_BORDER_COLOR_COMPONENT_MAPPING_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkSamplerBorderColorComponentMappingCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_MULTISAMPLED_RENDER_TO_SINGLE_SAMPLED_INFO_EXT:
		{
			auto *ci = static_cast<const VkMultisampledRenderToSingleSampledInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_DEPTH_BIAS_REPRESENTATION_INFO_EXT:
		{
			auto *ci = static_cast<const VkDepthBiasRepresentationInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_RENDER_PASS_FRAGMENT_DENSITY_MAP_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkRenderPassFragmentDensityMapCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT:
		{
			auto *ci = static_cast<const VkSampleLocationsInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_ROBUSTNESS_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineRobustnessCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLAMP_CONTROL_CREATE_INFO_EXT:
		{
			auto *ci = static_cast<const VkPipelineViewportDepthClampControlCreateInfoEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc, dynamic_state_info));
			break;
		}

		case VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_LOCATION_INFO_KHR:
		{
			auto *ci = static_cast<const VkRenderingAttachmentLocationInfoKHR *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_RENDERING_INPUT_ATTACHMENT_INDEX_INFO_KHR:
		{
			auto *ci = static_cast<const VkRenderingInputAttachmentIndexInfoKHR *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct(ci, alloc));
			break;
		}

		default:
			LOGE_LEVEL("Cannot copy unknown pNext sType: %d.\n", int(pin->sType));
			return false;
		}

		pNext = pin->pNext;
		ppNext = const_cast<const VkBaseInStructure **>(&(*ppNext)->pNext);
		*ppNext = nullptr;
	}

	*out_pnext = new_pnext.pNext;
	return true;
}